

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void duckdb::MaybeRepartition
               (ClientContext *context,RadixHTGlobalSinkState *gstate,RadixHTLocalSinkState *lstate)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  type pGVar5;
  type this_00;
  ArenaAllocator *this_01;
  idx_t iVar6;
  type pPVar7;
  idx_t iVar8;
  ulong uVar9;
  BufferManager *pBVar10;
  type pTVar11;
  pointer this_02;
  undefined4 extraout_var;
  idx_t iVar12;
  TupleDataLayout *pTVar13;
  ulong uVar14;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_03;
  undefined1 auVar15 [16];
  double dVar16;
  unique_lock<std::mutex> guard;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  type local_48;
  __atomic_base<unsigned_long> local_40;
  pointer local_38;
  
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lstate;
  pGVar5 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator*(&lstate->ht);
  this_00 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator*(&gstate->temporary_memory_state);
  ::std::__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)&guard,
             (__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar5->aggregate_allocator);
  this_01 = shared_ptr<duckdb::ArenaAllocator,_true>::operator->
                      ((shared_ptr<duckdb::ArenaAllocator,_true> *)&guard);
  iVar6 = ArenaAllocator::AllocationSize(this_01);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
  this_03 = &pGVar5->partitioned_data;
  pPVar7 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator*(this_03);
  iVar8 = PartitionedTupleData::SizeInBytes(pPVar7);
  uVar14 = iVar8 + iVar6 + pGVar5->capacity * 8;
  local_48 = pGVar5;
  iVar8 = TemporaryMemoryState::GetReservation(this_00);
  uVar9 = iVar8 / gstate->number_of_threads;
  if ((uVar9 < uVar14) && (((gstate->external)._M_base._M_i & 1U) == 0)) {
    ::std::unique_lock<std::mutex>::unique_lock
              (&guard,&(gstate->super_GlobalSinkState).super_StateWithBlockableTasks.lock);
    iVar8 = TemporaryMemoryState::GetReservation(this_00);
    uVar9 = iVar8 / gstate->number_of_threads;
    if (uVar9 < uVar14) {
      TemporaryMemoryState::SetMinimumReservation
                (this_00,(gstate->minimum_reservation).super___atomic_base<unsigned_long>._M_i +
                         gstate->number_of_threads * iVar6);
      iVar6 = gstate->number_of_threads;
      iVar8 = TemporaryMemoryState::GetRemainingSize(this_00);
      uVar9 = iVar6 * uVar14;
      if (uVar9 < iVar8 || uVar9 - iVar8 == 0) {
        uVar9 = iVar8;
      }
      TemporaryMemoryState::SetRemainingSizeAndUpdateReservation(this_00,context,uVar9 * 2);
      iVar6 = TemporaryMemoryState::GetReservation(this_00);
      uVar9 = iVar6 / gstate->number_of_threads;
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  }
  pGVar5 = local_48;
  if (uVar9 < uVar14) {
    bVar3 = RadixHTConfig::SetRadixBitsToExternal(&gstate->config);
    if (bVar3) {
      this = (unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              *)&local_50._M_pi[8]._M_use_count;
      if ((((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             *)&local_50._M_pi[8]._M_use_count)->
          super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
          .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl ==
          (PartitionedTupleData *)0x0) {
        pBVar10 = BufferManager::GetBufferManager(context);
        ::std::__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)&guard,
                   (__shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2> *)
                   &gstate->radix_ht->layout_ptr);
        local_40._M_i = (gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i;
        pTVar11 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                            (&gstate->radix_ht->layout_ptr);
        local_38 = (pointer)(((long)(pTVar11->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar11->types).
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   .
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18 + -1);
        make_uniq<duckdb::RadixPartitionedTupleData,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>,unsigned_long,unsigned_long>
                  ((duckdb *)&local_58,pBVar10,(shared_ptr<duckdb::TupleDataLayout,_true> *)&guard,
                   &local_40._M_i,(unsigned_long *)&local_38);
        _Var2._M_head_impl = local_58._M_head_impl;
        local_58._M_head_impl = (PartitionedTupleData *)0x0;
        _Var1._M_head_impl =
             (this->
             super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
             .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
        (this->
        super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
             _Var2._M_head_impl;
        if (_Var1._M_head_impl != (PartitionedTupleData *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_PartitionedTupleData + 8))();
          if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
            (**(code **)&(((((vector<duckdb::LogicalType,_true> *)
                            &(local_58._M_head_impl)->_vptr_PartitionedTupleData)->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start)->type_info_).internal)();
          }
        }
        local_58._M_head_impl = (PartitionedTupleData *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&guard._M_owns);
      }
      pGVar5->radix_bits = (gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i;
      GroupedAggregateHashTable::AcquirePartitionedData((GroupedAggregateHashTable *)&guard);
      this_02 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                              *)&guard);
      pPVar7 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator*(this);
      PartitionedTupleData::Repartition(this_02,context,pPVar7);
      if (guard._M_device != (mutex_type *)0x0) {
        (**(code **)(((guard._M_device)->super___mutex_base)._M_mutex.__align + 8))();
      }
    }
  }
  if (2 < gstate->number_of_threads) {
    local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&gstate->config;
    pPVar7 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator*(this_03);
    iVar6 = PartitionedTupleData::PartitionCount(pPVar7);
    iVar8 = RadixPartitioning::RadixBitsOfPowerOfTwo(iVar6);
    pBVar10 = BufferManager::GetBufferManager(context);
    iVar4 = (*pBVar10->_vptr_BufferManager[0xf])(pBVar10);
    auVar15._4_4_ = extraout_var;
    auVar15._0_4_ = iVar4;
    iVar12 = GroupedAggregateHashTable::GetMaterializedCount(pGVar5);
    pPVar7 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator*(this_03);
    pTVar13 = PartitionedTupleData::GetLayout(pPVar7);
    auVar15._8_4_ = extraout_var;
    auVar15._12_4_ = 0x45300000;
    dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 1.8;
    uVar14 = (ulong)dVar16;
    if (((long)(dVar16 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) <
        (iVar12 * pTVar13->row_width) / iVar6) {
      guard._M_device = (mutex_type *)(iVar8 + 2);
      RadixHTConfig::SetRadixBits((RadixHTConfig *)local_50._M_pi,(idx_t *)&guard);
    }
    iVar6 = (gstate->config).sink_radix_bits.super___atomic_base<unsigned_long>._M_i;
    if (iVar8 != iVar6) {
      local_48->radix_bits = iVar6;
      GroupedAggregateHashTable::Repartition(local_48);
    }
  }
  return;
}

Assistant:

void MaybeRepartition(ClientContext &context, RadixHTGlobalSinkState &gstate, RadixHTLocalSinkState &lstate) {
	auto &config = gstate.config;
	auto &ht = *lstate.ht;

	// Check if we're approaching the memory limit
	auto &temporary_memory_state = *gstate.temporary_memory_state;
	const auto aggregate_allocator_size = ht.GetAggregateAllocator()->AllocationSize();
	const auto total_size =
	    aggregate_allocator_size + ht.GetPartitionedData().SizeInBytes() + ht.Capacity() * sizeof(ht_entry_t);
	idx_t thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
	if (total_size > thread_limit) {
		// We're over the thread memory limit
		if (!gstate.external) {
			// We haven't yet triggered out-of-core behavior, but maybe we don't have to, grab the lock and check again
			auto guard = gstate.Lock();
			thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
			if (total_size > thread_limit) {
				// Out-of-core would be triggered below, update minimum reservation and try to increase the reservation
				temporary_memory_state.SetMinimumReservation(aggregate_allocator_size * gstate.number_of_threads +
				                                             gstate.minimum_reservation);
				auto remaining_size =
				    MaxValue<idx_t>(gstate.number_of_threads * total_size, temporary_memory_state.GetRemainingSize());
				temporary_memory_state.SetRemainingSizeAndUpdateReservation(context, 2 * remaining_size);
				thread_limit = temporary_memory_state.GetReservation() / gstate.number_of_threads;
			}
		}
	}

	if (total_size > thread_limit) {
		if (gstate.config.SetRadixBitsToExternal()) {
			// We're approaching the memory limit, unpin the data
			if (!lstate.abandoned_data) {
				lstate.abandoned_data = make_uniq<RadixPartitionedTupleData>(
				    BufferManager::GetBufferManager(context), gstate.radix_ht.GetLayoutPtr(), config.GetRadixBits(),
				    gstate.radix_ht.GetLayout().ColumnCount() - 1);
			}
			ht.SetRadixBits(gstate.config.GetRadixBits());
			ht.AcquirePartitionedData()->Repartition(context, *lstate.abandoned_data);
		}
	}

	// We can go external when there are few threads, but we shouldn't repartition here
	if (gstate.number_of_threads <= RadixHTConfig::GROW_STRATEGY_THREAD_THRESHOLD) {
		return;
	}

	const auto partition_count = ht.GetPartitionedData().PartitionCount();
	const auto current_radix_bits = RadixPartitioning::RadixBitsOfPowerOfTwo(partition_count);
	D_ASSERT(current_radix_bits <= config.GetRadixBits());

	const auto block_size = BufferManager::GetBufferManager(context).GetBlockSize();
	const auto row_size_per_partition =
	    ht.GetMaterializedCount() * ht.GetPartitionedData().GetLayout().GetRowWidth() / partition_count;
	if (row_size_per_partition > LossyNumericCast<idx_t>(config.BLOCK_FILL_FACTOR * static_cast<double>(block_size))) {
		// We crossed our block filling threshold, try to increment radix bits
		config.SetRadixBits(current_radix_bits + config.REPARTITION_RADIX_BITS);
	}

	const auto global_radix_bits = config.GetRadixBits();
	if (current_radix_bits == global_radix_bits) {
		return; // We're already on the right number of radix bits
	}

	// We're out-of-sync with the global radix bits, repartition
	ht.SetRadixBits(global_radix_bits);
	ht.Repartition();
}